

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int FreeEXRImage(EXRImage *exr_image)

{
  long *in_RDI;
  int i_1;
  int tid;
  int i;
  int local_1c;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar1;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = -3;
  }
  else {
    if (in_RDI[1] != 0) {
      FreeEXRImage((EXRImage *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if ((void *)in_RDI[1] != (void *)0x0) {
        operator_delete((void *)in_RDI[1]);
      }
    }
    for (iVar1 = 0; iVar1 < (int)in_RDI[5]; iVar1 = iVar1 + 1) {
      if ((in_RDI[3] != 0) && (*(long *)(in_RDI[3] + (long)iVar1 * 8) != 0)) {
        free(*(void **)(in_RDI[3] + (long)iVar1 * 8));
      }
    }
    if (in_RDI[3] != 0) {
      free((void *)in_RDI[3]);
    }
    if (*in_RDI != 0) {
      for (iVar1 = 0; iVar1 < *(int *)((long)in_RDI + 0x2c); iVar1 = iVar1 + 1) {
        for (local_1c = 0; local_1c < (int)in_RDI[5]; local_1c = local_1c + 1) {
          if ((*(long *)(*in_RDI + (long)iVar1 * 0x20 + 0x18) != 0) &&
             (*(long *)(*(long *)(*in_RDI + (long)iVar1 * 0x20 + 0x18) + (long)local_1c * 8) != 0))
          {
            free(*(void **)(*(long *)(*in_RDI + (long)iVar1 * 0x20 + 0x18) + (long)local_1c * 8));
          }
        }
        if (*(long *)(*in_RDI + (long)iVar1 * 0x20 + 0x18) != 0) {
          free(*(void **)(*in_RDI + (long)iVar1 * 0x20 + 0x18));
        }
      }
      free((void *)*in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int FreeEXRImage(EXRImage *exr_image) {
  if (exr_image == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_image->next_level) {
    FreeEXRImage(exr_image->next_level);
    delete exr_image->next_level;
  }

  for (int i = 0; i < exr_image->num_channels; i++) {
    if (exr_image->images && exr_image->images[i]) {
      free(exr_image->images[i]);
    }
  }

  if (exr_image->images) {
    free(exr_image->images);
  }

  if (exr_image->tiles) {
    for (int tid = 0; tid < exr_image->num_tiles; tid++) {
      for (int i = 0; i < exr_image->num_channels; i++) {
        if (exr_image->tiles[tid].images && exr_image->tiles[tid].images[i]) {
          free(exr_image->tiles[tid].images[i]);
        }
      }
      if (exr_image->tiles[tid].images) {
        free(exr_image->tiles[tid].images);
      }
    }
    free(exr_image->tiles);
  }

  return TINYEXR_SUCCESS;
}